

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::
Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
::rehash(Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
         *this,size_t sizeHint)

{
  byte bVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  Chain *pCVar5;
  MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath> *pMVar6;
  ulong uVar7;
  ulong uVar8;
  size_t index;
  long lVar9;
  size_t numBuckets;
  Span *pSVar10;
  long lVar11;
  R RVar12;
  Bucket BVar13;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar9 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar9 ^ 0x3f) & 0x3f);
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar12 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar12.spans;
  this->numBuckets = numBuckets;
  if (uVar2 < 0x80) {
    if (pSVar3 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar7 = 0;
    pSVar10 = pSVar3;
    do {
      lVar9 = 0;
      do {
        bVar1 = pSVar10->offsets[lVar9];
        if (bVar1 != 0xff) {
          pEVar4 = pSVar3[uVar7].entries;
          uVar8 = *(ulong *)pEVar4[bVar1].storage.data;
          uVar8 = (uVar8 >> 0x20 ^ uVar8) * -0x2917014799a6026d;
          uVar8 = (uVar8 >> 0x20 ^ uVar8) * -0x2917014799a6026d;
          BVar13 = Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath>>
                   ::findBucketWithHash<QtGraphicsAnchorLayout::AnchorVertex*>
                             ((Data<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath>>
                               *)this,(AnchorVertex **)(pEVar4 + bVar1),
                              uVar8 >> 0x20 ^ this->seed ^ uVar8);
          pMVar6 = Span<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
                   ::insert(BVar13.span,BVar13.index);
          pMVar6->key = *(AnchorVertex **)pEVar4[bVar1].storage.data;
          pCVar5 = *(Chain **)(pEVar4[bVar1].storage.data + 8);
          pEVar4 = pEVar4 + bVar1;
          (pEVar4->storage).data[8] = '\0';
          (pEVar4->storage).data[9] = '\0';
          (pEVar4->storage).data[10] = '\0';
          (pEVar4->storage).data[0xb] = '\0';
          (pEVar4->storage).data[0xc] = '\0';
          (pEVar4->storage).data[0xd] = '\0';
          (pEVar4->storage).data[0xe] = '\0';
          (pEVar4->storage).data[0xf] = '\0';
          pMVar6->value = pCVar5;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x80);
      Span<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
      ::freeData(pSVar3 + uVar7);
      uVar7 = uVar7 + 1;
      pSVar10 = pSVar10 + 1;
    } while (uVar7 != uVar2 >> 7);
  }
  lVar9 = *(long *)&pSVar3[-1].allocated;
  if (lVar9 != 0) {
    lVar11 = lVar9 * 0x90;
    do {
      Span<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
      ::freeData((Span<QHashPrivate::MultiNode<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
                  *)(pSVar3[-1].offsets + lVar11));
      lVar11 = lVar11 + -0x90;
    } while (lVar11 != 0);
  }
  operator_delete__(&pSVar3[-1].allocated,lVar9 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }